

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char16_t,char16_t>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  int iVar1;
  int iVar2;
  char16_t *pcVar3;
  long lVar4;
  long lVar5;
  char16_t *pcVar6;
  wchar32 wVar7;
  wchar32 wVar8;
  size_t sVar9;
  size_t sVar10;
  bool bVar11;
  
  pcVar6 = lhs._M_str;
  sVar9 = lhs._M_len;
  pcVar3 = rhs._M_str;
  if (sVar9 != rhs._M_len) {
    return false;
  }
  sVar10 = sVar9;
  if (sVar9 == 0) {
    bVar11 = true;
  }
  else {
    do {
      if (sVar10 == 0) {
        return false;
      }
      wVar7 = (wchar32)(ushort)*pcVar6;
      lVar4 = 1;
      if (((sVar9 == 1) || ((wVar7 & 0xfc00U) != 0xd800)) ||
         (((ushort)pcVar6[1] & 0xfc00) != 0xdc00)) {
        lVar5 = 1;
      }
      else {
        wVar7 = (uint)(ushort)*pcVar6 * 0x400 + (uint)(ushort)pcVar6[1] + L'\xfca02400';
        lVar5 = 2;
      }
      wVar8 = (wchar32)(ushort)*pcVar3;
      if (((sVar10 != 1) && ((wVar8 & 0xfc00U) == 0xd800)) &&
         (((ushort)pcVar3[1] & 0xfc00) == 0xdc00)) {
        wVar8 = (uint)(ushort)*pcVar3 * 0x400 + (uint)(ushort)pcVar3[1] + L'\xfca02400';
        lVar4 = 2;
      }
      if (wVar7 != wVar8) {
        iVar1 = jessilib::fold(wVar7);
        iVar2 = jessilib::fold(wVar8);
        if (iVar1 != iVar2) {
          return false;
        }
      }
      pcVar6 = pcVar6 + lVar5;
      sVar10 = sVar10 - lVar4;
      pcVar3 = pcVar3 + lVar4;
      sVar9 = sVar9 - lVar5;
    } while (sVar9 != 0);
    bVar11 = sVar10 == 0;
  }
  return bVar11;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}